

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseTopLevelStatement
          (Parser *this,FileDescriptorProto *file,LocationRecorder *root_location)

{
  LocationRecorder *pLVar1;
  bool bVar2;
  int iVar3;
  DescriptorProto *message;
  EnumDescriptorProto *enum_type;
  ServiceDescriptorProto *service;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *extensions;
  RepeatedPtrField<google::protobuf::DescriptorProto> *messages;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *dependency;
  RepeatedField<int> *public_dependency;
  RepeatedField<int> *weak_dependency;
  FileOptions *options;
  ErrorMaker local_140;
  undefined1 local_130 [8];
  LocationRecorder location_4;
  string_view local_108;
  string_view local_f8;
  undefined1 local_e8 [8];
  LocationRecorder location_3;
  undefined1 local_c0 [8];
  LocationRecorder location_2;
  undefined1 local_98 [8];
  LocationRecorder location_1;
  undefined1 local_60 [8];
  LocationRecorder location;
  string_view local_38;
  LocationRecorder *local_28;
  LocationRecorder *root_location_local;
  FileDescriptorProto *file_local;
  Parser *this_local;
  
  local_28 = root_location;
  root_location_local = (LocationRecorder *)file;
  file_local = (FileDescriptorProto *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,";");
  bVar2 = TryConsumeEndOfDeclaration(this,local_38,(LocationRecorder *)0x0);
  if (bVar2) {
    this_local._7_1_ = 1;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&location.location_,"message");
    bVar2 = LookingAt(this,stack0xffffffffffffffb8);
    pLVar1 = local_28;
    if (bVar2) {
      iVar3 = FileDescriptorProto::message_type_size((FileDescriptorProto *)root_location_local);
      LocationRecorder::LocationRecorder((LocationRecorder *)local_60,pLVar1,4,iVar3);
      iVar3 = internal::cpp::MaxMessageDeclarationNestingDepth();
      this->recursion_depth_ = iVar3;
      message = FileDescriptorProto::add_message_type((FileDescriptorProto *)root_location_local);
      this_local._7_1_ =
           ParseMessageDefinition
                     (this,message,(LocationRecorder *)local_60,
                      (FileDescriptorProto *)root_location_local);
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_60);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&location_1.location_,"enum");
      bVar2 = LookingAt(this,stack0xffffffffffffff80);
      pLVar1 = local_28;
      if (bVar2) {
        iVar3 = FileDescriptorProto::enum_type_size((FileDescriptorProto *)root_location_local);
        LocationRecorder::LocationRecorder((LocationRecorder *)local_98,pLVar1,5,iVar3);
        enum_type = FileDescriptorProto::add_enum_type((FileDescriptorProto *)root_location_local);
        this_local._7_1_ =
             ParseEnumDefinition(this,enum_type,(LocationRecorder *)local_98,
                                 (FileDescriptorProto *)root_location_local);
        LocationRecorder::~LocationRecorder((LocationRecorder *)local_98);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&location_2.location_,
                   "service");
        bVar2 = LookingAt(this,stack0xffffffffffffff58);
        pLVar1 = local_28;
        if (bVar2) {
          iVar3 = FileDescriptorProto::service_size((FileDescriptorProto *)root_location_local);
          LocationRecorder::LocationRecorder((LocationRecorder *)local_c0,pLVar1,6,iVar3);
          service = FileDescriptorProto::add_service((FileDescriptorProto *)root_location_local);
          this_local._7_1_ =
               ParseServiceDefinition
                         (this,service,(LocationRecorder *)local_c0,
                          (FileDescriptorProto *)root_location_local);
          LocationRecorder::~LocationRecorder((LocationRecorder *)local_c0);
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&location_3.location_,
                     "extend");
          bVar2 = LookingAt(this,stack0xffffffffffffff30);
          if (bVar2) {
            LocationRecorder::LocationRecorder((LocationRecorder *)local_e8,local_28,7);
            extensions = FileDescriptorProto::mutable_extension
                                   ((FileDescriptorProto *)root_location_local);
            messages = FileDescriptorProto::mutable_message_type
                                 ((FileDescriptorProto *)root_location_local);
            this_local._7_1_ =
                 ParseExtend(this,extensions,messages,local_28,4,(LocationRecorder *)local_e8,
                             (FileDescriptorProto *)root_location_local);
            LocationRecorder::~LocationRecorder((LocationRecorder *)local_e8);
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_f8,"import");
            bVar2 = LookingAt(this,local_f8);
            if (bVar2) {
              dependency = FileDescriptorProto::mutable_dependency_abi_cxx11_
                                     ((FileDescriptorProto *)root_location_local);
              public_dependency =
                   FileDescriptorProto::mutable_public_dependency
                             ((FileDescriptorProto *)root_location_local);
              weak_dependency =
                   FileDescriptorProto::mutable_weak_dependency
                             ((FileDescriptorProto *)root_location_local);
              this_local._7_1_ =
                   ParseImport(this,dependency,public_dependency,weak_dependency,local_28,
                               (FileDescriptorProto *)root_location_local);
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_108,"package");
              bVar2 = LookingAt(this,local_108);
              if (bVar2) {
                this_local._7_1_ =
                     ParsePackage(this,(FileDescriptorProto *)root_location_local,local_28,
                                  (FileDescriptorProto *)root_location_local);
              }
              else {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)&location_4.location_
                           ,"option");
                bVar2 = LookingAt(this,stack0xfffffffffffffee8);
                if (bVar2) {
                  LocationRecorder::LocationRecorder((LocationRecorder *)local_130,local_28,8);
                  options = FileDescriptorProto::mutable_options
                                      ((FileDescriptorProto *)root_location_local);
                  this_local._7_1_ =
                       ParseOption(this,&options->super_Message,(LocationRecorder *)local_130,
                                   (FileDescriptorProto *)root_location_local,OPTION_STATEMENT);
                  LocationRecorder::~LocationRecorder((LocationRecorder *)local_130);
                }
                else {
                  ErrorMaker::ErrorMaker
                            (&local_140,"Expected top-level statement (e.g. \"message\").");
                  RecordError(this,local_140);
                  this_local._7_1_ = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseTopLevelStatement(FileDescriptorProto* file,
                                    const LocationRecorder& root_location) {
  if (TryConsumeEndOfDeclaration(";", nullptr)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("message")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kMessageTypeFieldNumber,
                              file->message_type_size());
    // Maximum depth allowed by the DescriptorPool.
    recursion_depth_ = internal::cpp::MaxMessageDeclarationNestingDepth();
    return ParseMessageDefinition(file->add_message_type(), location, file);
  } else if (LookingAt("enum")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kEnumTypeFieldNumber,
                              file->enum_type_size());
    return ParseEnumDefinition(file->add_enum_type(), location, file);
  } else if (LookingAt("service")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kServiceFieldNumber,
                              file->service_size());
    return ParseServiceDefinition(file->add_service(), location, file);
  } else if (LookingAt("extend")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kExtensionFieldNumber);
    return ParseExtend(
        file->mutable_extension(), file->mutable_message_type(), root_location,
        FileDescriptorProto::kMessageTypeFieldNumber, location, file);
  } else if (LookingAt("import")) {
    return ParseImport(file->mutable_dependency(),
                       file->mutable_public_dependency(),
                       file->mutable_weak_dependency(), root_location, file);
  } else if (LookingAt("package")) {
    return ParsePackage(file, root_location, file);
  } else if (LookingAt("option")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kOptionsFieldNumber);
    return ParseOption(file->mutable_options(), location, file,
                       OPTION_STATEMENT);
  } else {
    RecordError("Expected top-level statement (e.g. \"message\").");
    return false;
  }
}